

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

void av1_init_lr_mt_buffers(AV1_COMP *cpi)

{
  int iVar1;
  long *in_RDI;
  int num_lr_workers;
  AV1LrSync *lr_sync;
  AV1_COMMON *cm;
  
  if (((int)in_RDI[0x1361c] != 0) &&
     (*(int *)(*in_RDI + 0x317c + (ulong)*(byte *)(in_RDI + 0xe258) * 4) < 1)) {
    iVar1 = av1_get_num_mod_workers_for_alloc((PrimaryMultiThreadInfo *)(*in_RDI + 0x123d0),MOD_LR);
    *(long *)(in_RDI[0x1361f] + (long)(iVar1 + -1) * 0x1c0) = in_RDI[0x834c];
    *(long *)(in_RDI[0x1361f] + (long)(iVar1 + -1) * 0x1c0 + 8) = in_RDI[0x834d];
  }
  return;
}

Assistant:

void av1_init_lr_mt_buffers(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  AV1LrSync *lr_sync = &cpi->mt_info.lr_row_sync;
  if (lr_sync->sync_range) {
    if (cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] > 0)
      return;
    int num_lr_workers =
        av1_get_num_mod_workers_for_alloc(&cpi->ppi->p_mt_info, MOD_LR);
    assert(num_lr_workers <= lr_sync->num_workers);
    lr_sync->lrworkerdata[num_lr_workers - 1].rst_tmpbuf = cm->rst_tmpbuf;
    lr_sync->lrworkerdata[num_lr_workers - 1].rlbs = cm->rlbs;
  }
}